

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

void __thiscall absl::lts_20250127::uint128::uint128(uint128 *this,double v)

{
  uint64_t uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  
  if ((-1.0 < v) && ((ulong)ABS(v) < 0x7ff0000000000000)) {
    dVar2 = ldexp(1.0,0x80);
    if (v < dVar2) {
      dVar2 = ldexp(1.0,0x40);
      if (dVar2 <= v) {
        dVar2 = ldexp(v,-0x40);
        uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
        auVar3._8_4_ = (int)(uVar1 >> 0x20);
        auVar3._0_8_ = uVar1;
        auVar3._12_4_ = 0x45300000;
        dVar2 = ldexp((auVar3._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0),0x40);
        v = v - dVar2;
      }
      else {
        uVar1 = 0;
      }
      this->lo_ = (long)(v - 9.223372036854776e+18) & (long)v >> 0x3f | (long)v;
      this->hi_ = uVar1;
      return;
    }
  }
  __assert_fail("std::isfinite(v) && v > -1 && (std::numeric_limits<T>::max_exponent <= 128 || v < std::ldexp(static_cast<T>(1), 128))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/numeric/int128.cc"
                ,100,
                "uint128 absl::lts_20250127::(anonymous namespace)::MakeUint128FromFloat(T) [T = double]"
               );
}

Assistant:

uint128::uint128(double v) : uint128(MakeUint128FromFloat(v)) {}